

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

Result<bilingual_str> * result_tests::StrFn(bilingual_str *s,bool success)

{
  byte bVar1;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_fffffffffffffea8;
  T *in_stack_fffffffffffffeb0;
  bilingual_str *in_stack_fffffffffffffeb8;
  Result<bilingual_str> *this;
  allocator<char> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  bilingual_str *fmt;
  allocator<char> local_e9 [97];
  Result<bilingual_str> local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  if (bVar1 == 0) {
    this = &local_88;
    fmt = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    Untranslated(&in_RDI->original);
    tinyformat::format<std::__cxx11::string>(fmt,in_RSI);
    util::Result<bilingual_str>::Result(this,(Error *)in_stack_fffffffffffffeb0);
    util::Error::~Error((Error *)in_stack_fffffffffffffea8);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(&in_stack_fffffffffffffea8->original);
    std::allocator<char>::~allocator(local_e9);
  }
  else {
    bilingual_str::bilingual_str(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    util::Result<bilingual_str>::Result
              ((Result<bilingual_str> *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffea8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Result<bilingual_str> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<bilingual_str> StrFn(bilingual_str s, bool success)
{
    if (success) return s;
    return util::Error{strprintf(Untranslated("str %s error."), s.original)};
}